

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O2

cilkred_map ** fast_path_reductions_for_spawn_return(__cilkrts_worker *w,full_frame *ff)

{
  full_frame *pfVar1;
  cilkred_map *pcVar2;
  byte bVar3;
  pending_exception_info **left_exception_ptr;
  cilkred_map **ppcVar4;
  cilkred_map **ppcVar5;
  
  if (w->l->pending_exception != (pending_exception_info *)0x0) {
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                  ,0xdd3,"NULL == w->l->pending_exception");
  }
  pfVar1 = ff->left_sibling;
  if (pfVar1 == (full_frame *)0x0) {
    ppcVar4 = &ff->parent->children_reducer_map;
    left_exception_ptr = &ff->parent->child_pending_exception;
  }
  else {
    ppcVar4 = &pfVar1->right_reducer_map;
    left_exception_ptr = &pfVar1->right_pending_exception;
  }
  splice_exceptions_for_spawn(w,ff,left_exception_ptr);
  bVar3 = (*ppcVar4 != (cilkred_map *)0x0) + (w->reducer_map != (cilkred_map *)0x0) * '\x02' +
          (ff->right_reducer_map != (cilkred_map *)0x0) * '\x04';
  if (1 < bVar3) {
    pcVar2 = w->reducer_map;
    ppcVar5 = &w->reducer_map;
    if ((bVar3 != 2) &&
       (pcVar2 = ff->right_reducer_map, ppcVar5 = &ff->right_reducer_map, bVar3 != 4)) {
      return ppcVar4;
    }
    *ppcVar4 = pcVar2;
    *ppcVar5 = (cilkred_map *)0x0;
  }
  return (cilkred_map **)0x0;
}

Assistant:

struct cilkred_map**
fast_path_reductions_for_spawn_return(__cilkrts_worker *w,
                                      full_frame *ff)
{
    // ASSERT: we hold ff->parent->lock.
    splice_left_ptrs left_ptrs;

    CILK_ASSERT(NULL == w->l->pending_exception);

    // Figure out the pointers to the left where I want
    // to put reducers and exceptions.
    left_ptrs = compute_left_ptrs_for_spawn_return(w, ff);
    
    // Go ahead and merge exceptions while holding the lock.
    splice_exceptions_for_spawn(w, ff, left_ptrs.exception_ptr);

    // Now check if we have any reductions to perform.
    //
    // Consider all the cases of left, middle and right maps.
    //  0. (-, -, -)  :  finish and return 1
    //  1. (L, -, -)  :  finish and return 1
    //  2. (-, M, -)  :  slide over to left, finish, and return 1.
    //  3. (L, M, -)  :  return 0
    //  4. (-, -, R)  :  slide over to left, finish, and return 1.
    //  5. (L, -, R)  :  return 0
    //  6. (-, M, R)  :  return 0
    //  7. (L, M, R)  :  return 0
    //
    // In terms of code:
    //  L == *left_ptrs.map_ptr
    //  M == w->reducer_map
    //  R == f->right_reducer_map.
    //
    // The goal of the code below is to execute the fast path with
    // as few branches and writes as possible.
    
    int case_value = (*(left_ptrs.map_ptr) != NULL);
    case_value += ((w->reducer_map != NULL) << 1);
    case_value += ((ff->right_reducer_map != NULL) << 2);

    // Fastest path is case_value == 0 or 1.
    if (case_value >=2) {
        switch (case_value) {
        case 2:
            *(left_ptrs.map_ptr) = w->reducer_map;
            w->reducer_map = NULL;
            return NULL;
            break;
        case 4:
            *(left_ptrs.map_ptr) = ff->right_reducer_map;
            ff->right_reducer_map = NULL;
            return NULL;
        default:
            // If we have to execute the slow path, then
            // return the pointer to the place to deposit the left
            // map.
            return left_ptrs.map_ptr;
        }
    }

    // Do nothing
    return NULL;
}